

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isVowel(char *z)

{
  char x;
  int j;
  char *z_local;
  
  if (*z == '\0') {
    z_local._4_4_ = 0;
  }
  else if (""[*z + -0x61] < 2) {
    z_local._4_4_ = 1 - ""[*z + -0x61];
  }
  else {
    z_local._4_4_ = isConsonant(z + 1);
  }
  return z_local._4_4_;
}

Assistant:

static int isVowel(const char *z){
  int j;
  char x = *z;
  if( x==0 ) return 0;
  assert( x>='a' && x<='z' );
  j = cType[x-'a'];
  if( j<2 ) return 1-j;
  return isConsonant(z + 1);
}